

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

void trt_pose::parse::munkresStep4
               (PairGraph *star_graph,PairGraph *prime_graph,CoverTable *cover_table,
               pair<int,_int> p)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (ulong)p >> 0x20;
  piVar2 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (prime_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    iVar6 = (int)uVar7;
    uVar1 = piVar3[iVar6];
    lVar8 = (long)(int)uVar1;
    iVar5 = p.first;
    if (lVar8 < 0) break;
    piVar2[lVar8] = -1;
    piVar2[iVar5] = iVar6;
    piVar3[iVar6] = iVar5;
    uVar7 = (ulong)(uint)piVar4[lVar8];
    p.second = 0;
    p.first = uVar1;
  }
  piVar2[iVar5] = iVar6;
  piVar3[iVar6] = iVar5;
  utils::CoverTable::clear(cover_table);
  utils::PairGraph::clear(prime_graph);
  return;
}

Assistant:

void munkresStep4(PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> p) {
  // repeat until no star found in prime's column
  while (star_graph.isColSet(p.second)) {
    // find and reset star in prime's column
    std::pair<int, int> s = {star_graph.rowForCol(p.second), p.second};
    star_graph.reset(s.first, s.second);

    // set this prime to a star
    star_graph.set(p.first, p.second);

    // repeat for prime in cleared star's row
    p = {s.first, prime_graph.colForRow(s.first)};
  }
  star_graph.set(p.first, p.second);
  cover_table.clear();
  prime_graph.clear();
}